

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loguru.cpp
# Opt level: O3

void loguru::log_message(int stack_trace_skip,Message *message,bool with_indentation,
                        bool abort_if_fatal)

{
  int iVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  Text __ptr_00;
  int iVar5;
  undefined8 *puVar6;
  uint uVar7;
  char *pcVar8;
  pointer *__ptr;
  EcEntryBase *unaff_R12;
  Callback *p;
  Text st;
  Text ec;
  
  iVar1 = message->verbosity;
  iVar5 = pthread_mutex_lock((pthread_mutex_t *)s_mutex);
  if (iVar5 != 0) {
    std::__throw_system_error(iVar5);
LAB_0010be6c:
    signal(6,(__sighandler_t)0x0);
    abort();
  }
  if (message->verbosity == -3) {
    stacktrace((loguru *)&st,stack_trace_skip + 2);
    __ptr_00 = st;
    if ((st._str != (char *)0x0) && (*st._str != '\0')) {
      iVar5 = s_max_out_verbosity;
      if (s_max_out_verbosity < g_stderr_verbosity) {
        iVar5 = g_stderr_verbosity;
      }
      if (-3 < iVar5) {
        raw_log(-2,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/lscpp/external/loguru/loguru.cpp"
                ,0x4c1,"Stack trace:\n%s",st._str);
      }
    }
    get_thread_ec_head_ref();
    get_error_context_for(unaff_R12);
    if ((ec._str != (char *)0x0) && (*ec._str != '\0')) {
      iVar5 = s_max_out_verbosity;
      if (s_max_out_verbosity < g_stderr_verbosity) {
        iVar5 = g_stderr_verbosity;
      }
      if (-3 < iVar5) {
        raw_log(-2,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/lscpp/external/loguru/loguru.cpp"
                ,0x4c6,"%s",ec._str);
      }
    }
    free(ec._str);
    free(__ptr_00._str);
  }
  if (with_indentation) {
    uVar7 = 100;
    if (s_stderr_indentation < 100) {
      uVar7 = s_stderr_indentation;
    }
    message->indentation =
         ".   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   "
         + (400 - (ulong)(uVar7 << 2));
  }
  lVar2 = s_callbacks;
  lVar3 = DAT_001569a0;
  if (iVar1 <= g_stderr_verbosity) {
    if ((g_colorlogtostderr == '\x01') && (s_terminal_has_color == '\x01')) {
      if (iVar1 < 0) {
        pcVar8 = "\x1b[31m";
        if (iVar1 == -1) {
          pcVar8 = "\x1b[33m";
        }
        fprintf(_stderr,"%s%s%s%s%s%s%s\n","\x1b[0m",pcVar8,message->preamble,message->indentation,
                message->prefix,message->message,"\x1b[0m");
      }
      else {
        pcVar8 = "";
        if (iVar1 == 0) {
          pcVar8 = "\x1b[0m";
        }
        fprintf(_stderr,"%s%s%s%s%s%s%s%s\n","\x1b[0m","\x1b[2m",message->preamble,
                message->indentation,pcVar8,message->prefix,message->message,"\x1b[0m");
      }
    }
    else {
      log_message();
    }
    if (g_flush_interval_ms == 0) {
      fflush(_stderr);
      lVar2 = s_callbacks;
      lVar3 = DAT_001569a0;
    }
    else {
      s_needs_flushing = 1;
      lVar2 = s_callbacks;
      lVar3 = DAT_001569a0;
    }
  }
  for (; lVar4 = DAT_001569a0, lVar2 != DAT_001569a0; lVar2 = lVar2 + 0x50) {
    DAT_001569a0 = lVar3;
    if (iVar1 <= *(int *)(lVar2 + 0x30)) {
      if (with_indentation) {
        uVar7 = *(uint *)(lVar2 + 0x48);
        if (99 < uVar7) {
          uVar7 = 100;
        }
        message->indentation =
             ".   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   .   "
             + (400 - (ulong)(uVar7 << 2));
      }
      (**(code **)(lVar2 + 0x20))(*(undefined8 *)(lVar2 + 0x28));
      if (g_flush_interval_ms == 0) {
        if (*(code **)(lVar2 + 0x40) != (code *)0x0) {
          (**(code **)(lVar2 + 0x40))(*(undefined8 *)(lVar2 + 0x28));
        }
      }
      else {
        s_needs_flushing = 1;
      }
    }
    lVar3 = DAT_001569a0;
    DAT_001569a0 = lVar4;
  }
  DAT_001569a0 = lVar3;
  puVar6 = s_flush_thread;
  if ((g_flush_interval_ms != 0) && (s_flush_thread == (undefined8 *)0x0)) {
    puVar6 = (undefined8 *)operator_new(8);
    *puVar6 = 0;
    st._str = (char *)operator_new(0x10);
    *(undefined ***)st._str = &PTR___State_00155650;
    std::thread::_M_start_thread(puVar6,&st,0);
    if (st._str != (char *)0x0) {
      (**(code **)(*(long *)st._str + 8))();
    }
  }
  s_flush_thread = puVar6;
  if (message->verbosity == -3) {
    flush();
    if (s_fatal_handler != (code *)0x0) {
      (*s_fatal_handler)(message);
      flush();
    }
    if (abort_if_fatal) goto LAB_0010be6c;
  }
  pthread_mutex_unlock((pthread_mutex_t *)s_mutex);
  return;
}

Assistant:

static void log_message(int stack_trace_skip, Message& message, bool with_indentation, bool abort_if_fatal)
	{
		const auto verbosity = message.verbosity;
		std::lock_guard<std::recursive_mutex> lock(s_mutex);

		if (message.verbosity == Verbosity_FATAL) {
			auto st = loguru::stacktrace(stack_trace_skip + 2);
			if (!st.empty()) {
				RAW_LOG_F(ERROR, "Stack trace:\n%s", st.c_str());
			}

			auto ec = loguru::get_error_context();
			if (!ec.empty()) {
				RAW_LOG_F(ERROR, "%s", ec.c_str());
			}
		}

		if (with_indentation) {
			message.indentation = indentation(s_stderr_indentation);
		}

		if (verbosity <= g_stderr_verbosity) {
			if (g_colorlogtostderr && s_terminal_has_color) {
				if (verbosity > Verbosity_WARNING) {
					fprintf(stderr, "%s%s%s%s%s%s%s%s\n",
						terminal_reset(),
						terminal_dim(),
						message.preamble,
						message.indentation,
						verbosity == Verbosity_INFO ? terminal_reset() : "", // un-dim for info
						message.prefix,
						message.message,
						terminal_reset());
				} else {
					fprintf(stderr, "%s%s%s%s%s%s%s\n",
						terminal_reset(),
						verbosity == Verbosity_WARNING ? terminal_yellow() : terminal_red(),
						message.preamble,
						message.indentation,
						message.prefix,
						message.message,
						terminal_reset());
				}
			} else {
				fprintf(stderr, "%s%s%s%s\n",
					message.preamble, message.indentation, message.prefix, message.message);
			}

			if (g_flush_interval_ms == 0) {
				fflush(stderr);
			} else {
				s_needs_flushing = true;
			}
		}

		for (auto& p : s_callbacks) {
			if (verbosity <= p.verbosity) {
				if (with_indentation) {
					message.indentation = indentation(p.indentation);
				}
				p.callback(p.user_data, message);
				if (g_flush_interval_ms == 0) {
					if (p.flush) { p.flush(p.user_data); }
				} else {
					s_needs_flushing = true;
				}
			}
		}

		if (g_flush_interval_ms > 0 && !s_flush_thread) {
			s_flush_thread = new std::thread([](){
				for (;;) {
					if (s_needs_flushing) {
						flush();
					}
					std::this_thread::sleep_for(std::chrono::milliseconds(g_flush_interval_ms));
				}
			});
		}

		if (message.verbosity == Verbosity_FATAL) {
			flush();

			if (s_fatal_handler) {
				s_fatal_handler(message);
				flush();
			}

			if (abort_if_fatal) {
#if LOGURU_CATCH_SIGABRT && !defined(_WIN32)
				// Make sure we don't catch our own abort:
				signal(SIGABRT, SIG_DFL);
#endif
				abort();
			}
		}
	}